

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O1

void __thiscall DStrobe::Serialize(DStrobe *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DSectorEffect::Serialize((DSectorEffect *)this,arc);
  pFVar1 = ::Serialize(arc,"count",&this->m_Count,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"maxlight",&this->m_MaxLight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"minlight",&this->m_MinLight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"darktime",&this->m_DarkTime,(int32_t *)0x0);
  ::Serialize(pFVar1,"brighttime",&this->m_BrightTime,(int32_t *)0x0);
  return;
}

Assistant:

void DStrobe::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("count", m_Count)
		("maxlight", m_MaxLight)
		("minlight", m_MinLight)
		("darktime", m_DarkTime)
		("brighttime", m_BrightTime);
}